

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

string_view slang::ast::getNonValueName(Symbol *symbol)

{
  bool bVar1;
  GenerateBlockSymbol *this;
  Scope *this_00;
  Symbol *in_RDI;
  Scope *scope;
  GenerateBlockSymbol *block;
  Symbol *sym;
  InstanceSymbolBase *inst;
  InstanceSymbolBase *in_stack_ffffffffffffffd0;
  Symbol *local_28;
  string_view local_10;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RDI->name);
  if (bVar1) {
    if ((in_RDI->kind == Instance) || (local_28 = in_RDI, in_RDI->kind == CheckerInstance)) {
      Symbol::as<slang::ast::InstanceSymbolBase>((Symbol *)0x9f2a8e);
      local_10 = InstanceSymbolBase::getArrayName(in_stack_ffffffffffffffd0);
    }
    else {
      while (local_28->kind == GenerateBlock) {
        this = Symbol::as<slang::ast::GenerateBlockSymbol>((Symbol *)0x9f2aca);
        if (this->arrayIndex == (SVInt *)0x0) {
          return local_28->name;
        }
        this_00 = Symbol::getParentScope(&this->super_Symbol);
        local_28 = Scope::asSymbol(this_00);
      }
      local_10 = local_28->name;
    }
  }
  else {
    local_10 = in_RDI->name;
  }
  return local_10;
}

Assistant:

static std::string_view getNonValueName(const Symbol& symbol) {
    if (symbol.name.empty()) {
        if (symbol.kind == SymbolKind::Instance || symbol.kind == SymbolKind::CheckerInstance) {
            auto& inst = symbol.as<InstanceSymbolBase>();
            return inst.getArrayName();
        }

        auto sym = &symbol;
        while (sym->kind == SymbolKind::GenerateBlock) {
            auto& block = sym->as<GenerateBlockSymbol>();
            if (!block.arrayIndex)
                return sym->name;

            auto scope = block.getParentScope();
            SLANG_ASSERT(scope);
            sym = &scope->asSymbol();
        }

        return sym->name;
    }
    return symbol.name;
}